

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall spv::Builder::importNonSemanticShaderDebugInfoInstructions(Builder *this)

{
  Id IVar1;
  
  if (this->emitNonSemanticShaderDebugInfo != false) {
    if (this->nonSemanticShaderDebugInfo == 0) {
      addExtension(this,"SPV_KHR_non_semantic_info");
      IVar1 = import(this,"NonSemantic.Shader.DebugInfo.100");
      this->nonSemanticShaderDebugInfo = IVar1;
    }
    return this->nonSemanticShaderDebugInfo;
  }
  __assert_fail("emitNonSemanticShaderDebugInfo == true",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x71d,"Id spv::Builder::importNonSemanticShaderDebugInfoInstructions()");
}

Assistant:

Id Builder::importNonSemanticShaderDebugInfoInstructions()
{
    assert(emitNonSemanticShaderDebugInfo == true);

    if(nonSemanticShaderDebugInfo == 0)
    {
        this->addExtension(spv::E_SPV_KHR_non_semantic_info);
        nonSemanticShaderDebugInfo = this->import("NonSemantic.Shader.DebugInfo.100");
    }

    return nonSemanticShaderDebugInfo;
}